

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O0

ASTNode * AST::ASTBuilder::createCustomNode(string *nodeName,Token *token)

{
  bool bVar1;
  string *psVar2;
  ASTNode *this;
  string local_480;
  undefined1 local_459;
  string local_458;
  undefined1 local_431;
  string local_430;
  undefined1 local_409;
  string local_408;
  undefined1 local_3e1;
  string local_3e0;
  undefined1 local_3b9;
  string local_3b8;
  undefined1 local_391;
  string local_390;
  undefined1 local_369;
  string local_368;
  undefined1 local_341;
  string local_340;
  undefined1 local_319;
  string local_318;
  undefined1 local_2f1;
  string local_2f0;
  undefined1 local_2c9;
  string local_2c8;
  undefined1 local_2a1;
  string local_2a0;
  undefined1 local_279;
  string local_278;
  undefined1 local_251;
  string local_250;
  undefined1 local_229;
  string local_228;
  undefined1 local_201;
  string local_200;
  undefined1 local_1d9;
  string local_1d8;
  undefined1 local_1b1;
  string local_1b0;
  undefined1 local_189;
  string local_188;
  undefined1 local_161;
  string local_160;
  undefined1 local_139;
  string local_138;
  undefined1 local_111;
  string local_110;
  undefined1 local_e9;
  string local_e8;
  undefined1 local_c1;
  string local_c0;
  undefined1 local_99;
  string local_98;
  undefined1 local_71;
  string local_70;
  undefined1 local_4d;
  string local_40;
  Token *local_20;
  Token *token_local;
  string *nodeName_local;
  
  local_20 = token;
  token_local = (Token *)nodeName;
  bVar1 = std::operator==(nodeName,"add");
  if (bVar1) {
    psVar2 = (string *)operator_new(200);
    local_4d = 1;
    std::__cxx11::string::string((string *)&local_40,(string *)token_local);
    AddOp::AddOp((AddOp *)psVar2,&local_40,local_20);
    local_4d = 0;
    nodeName_local = psVar2;
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token_local,"ARRAYDIMENSIONS");
    if (bVar1) {
      psVar2 = (string *)operator_new(200);
      local_71 = 1;
      std::__cxx11::string::string((string *)&local_70,(string *)token_local);
      ArrayDim::ArrayDim((ArrayDim *)psVar2,&local_70,local_20);
      local_71 = 0;
      nodeName_local = psVar2;
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              token_local,"=");
      if (bVar1) {
        psVar2 = (string *)operator_new(200);
        local_99 = 1;
        std::__cxx11::string::string((string *)&local_98,(string *)token_local);
        AssignOp::AssignOp((AssignOp *)psVar2,&local_98,local_20);
        local_99 = 0;
        nodeName_local = psVar2;
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )token_local,"calls");
        if (bVar1) {
          psVar2 = (string *)operator_new(200);
          local_c1 = 1;
          std::__cxx11::string::string((string *)&local_c0,(string *)token_local);
          Calls::Calls((Calls *)psVar2,&local_c0,local_20);
          local_c1 = 0;
          nodeName_local = psVar2;
          std::__cxx11::string::~string((string *)&local_c0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)token_local,"call");
          if (bVar1) {
            psVar2 = (string *)operator_new(200);
            local_e9 = 1;
            std::__cxx11::string::string((string *)&local_e8,(string *)token_local);
            Call::Call((Call *)psVar2,&local_e8,local_20);
            local_e9 = 0;
            nodeName_local = psVar2;
            std::__cxx11::string::~string((string *)&local_e8);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)token_local,"classes");
            if (bVar1) {
              psVar2 = (string *)operator_new(200);
              local_111 = 1;
              std::__cxx11::string::string((string *)&local_110,(string *)token_local);
              ClassDecls::ClassDecls((ClassDecls *)psVar2,&local_110,local_20);
              local_111 = 0;
              nodeName_local = psVar2;
              std::__cxx11::string::~string((string *)&local_110);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)token_local,"class");
              if (bVar1) {
                psVar2 = (string *)operator_new(200);
                local_139 = 1;
                std::__cxx11::string::string((string *)&local_138,(string *)token_local);
                ClassDecl::ClassDecl((ClassDecl *)psVar2,&local_138,local_20);
                local_139 = 0;
                nodeName_local = psVar2;
                std::__cxx11::string::~string((string *)&local_138);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)token_local,"cmp");
                if (bVar1) {
                  psVar2 = (string *)operator_new(200);
                  local_161 = 1;
                  std::__cxx11::string::string((string *)&local_160,(string *)token_local);
                  CompareOp::CompareOp((CompareOp *)psVar2,&local_160,local_20);
                  local_161 = 0;
                  nodeName_local = psVar2;
                  std::__cxx11::string::~string((string *)&local_160);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)token_local,"func_body");
                  if (bVar1) {
                    psVar2 = (string *)operator_new(200);
                    local_189 = 1;
                    std::__cxx11::string::string((string *)&local_188,(string *)token_local);
                    FuncBody::FuncBody((FuncBody *)psVar2,&local_188,local_20);
                    local_189 = 0;
                    nodeName_local = psVar2;
                    std::__cxx11::string::~string((string *)&local_188);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)token_local,"func_call");
                    if (bVar1) {
                      psVar2 = (string *)operator_new(200);
                      local_1b1 = 1;
                      std::__cxx11::string::string((string *)&local_1b0,(string *)token_local);
                      FuncCall::FuncCall((FuncCall *)psVar2,&local_1b0,local_20);
                      local_1b1 = 0;
                      nodeName_local = psVar2;
                      std::__cxx11::string::~string((string *)&local_1b0);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)token_local,"func_def");
                      if (bVar1) {
                        psVar2 = (string *)operator_new(200);
                        local_1d9 = 1;
                        std::__cxx11::string::string((string *)&local_1d8,(string *)token_local);
                        FuncDef::FuncDef((FuncDef *)psVar2,&local_1d8,local_20);
                        local_1d9 = 0;
                        nodeName_local = psVar2;
                        std::__cxx11::string::~string((string *)&local_1d8);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)token_local,"func_decl");
                        if (bVar1) {
                          psVar2 = (string *)operator_new(200);
                          local_201 = 1;
                          std::__cxx11::string::string((string *)&local_200,(string *)token_local);
                          FuncDecl::FuncDecl((FuncDecl *)psVar2,&local_200,local_20);
                          local_201 = 0;
                          nodeName_local = psVar2;
                          std::__cxx11::string::~string((string *)&local_200);
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"params");
                          if (bVar1) {
                            psVar2 = (string *)operator_new(200);
                            local_229 = 1;
                            std::__cxx11::string::string((string *)&local_228,(string *)token_local)
                            ;
                            FuncParams::FuncParams((FuncParams *)psVar2,&local_228,local_20);
                            local_229 = 0;
                            nodeName_local = psVar2;
                            std::__cxx11::string::~string((string *)&local_228);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"params_call");
                            if (bVar1) {
                              psVar2 = (string *)operator_new(200);
                              local_251 = 1;
                              std::__cxx11::string::string
                                        ((string *)&local_250,(string *)token_local);
                              FuncCallParams::FuncCallParams
                                        ((FuncCallParams *)psVar2,&local_250,local_20);
                              local_251 = 0;
                              nodeName_local = psVar2;
                              std::__cxx11::string::~string((string *)&local_250);
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"if");
                              if (bVar1) {
                                psVar2 = (string *)operator_new(200);
                                local_279 = 1;
                                std::__cxx11::string::string
                                          ((string *)&local_278,(string *)token_local);
                                If::If((If *)psVar2,&local_278,local_20);
                                local_279 = 0;
                                nodeName_local = psVar2;
                                std::__cxx11::string::~string((string *)&local_278);
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"LOCALSCOPE");
                                if (bVar1) {
                                  psVar2 = (string *)operator_new(200);
                                  local_2a1 = 1;
                                  std::__cxx11::string::string
                                            ((string *)&local_2a0,(string *)token_local);
                                  Local::Local((Local *)psVar2,&local_2a0,local_20);
                                  local_2a1 = 0;
                                  nodeName_local = psVar2;
                                  std::__cxx11::string::~string((string *)&local_2a0);
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"main");
                                  if (bVar1) {
                                    psVar2 = (string *)operator_new(200);
                                    local_2c9 = 1;
                                    std::__cxx11::string::string
                                              ((string *)&local_2c8,(string *)token_local);
                                    MainFunc::MainFunc((MainFunc *)psVar2,&local_2c8,local_20);
                                    local_2c9 = 0;
                                    nodeName_local = psVar2;
                                    std::__cxx11::string::~string((string *)&local_2c8);
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"mult");
                                    if (bVar1) {
                                      psVar2 = (string *)operator_new(200);
                                      local_2f1 = 1;
                                      std::__cxx11::string::string
                                                ((string *)&local_2f0,(string *)token_local);
                                      MultOp::MultOp((MultOp *)psVar2,&local_2f0,local_20);
                                      local_2f1 = 0;
                                      nodeName_local = psVar2;
                                      std::__cxx11::string::~string((string *)&local_2f0);
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"number");
                                      if (bVar1) {
                                        psVar2 = (string *)operator_new(200);
                                        local_319 = 1;
                                        std::__cxx11::string::string
                                                  ((string *)&local_318,(string *)token_local);
                                        Number::Number((Number *)psVar2,&local_318,local_20);
                                        local_319 = 0;
                                        nodeName_local = psVar2;
                                        std::__cxx11::string::~string((string *)&local_318);
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"PROGRAM");
                                        if (bVar1) {
                                          psVar2 = (string *)operator_new(200);
                                          local_341 = 1;
                                          std::__cxx11::string::string
                                                    ((string *)&local_340,(string *)token_local);
                                          Program::Program((Program *)psVar2,&local_340,local_20);
                                          local_341 = 0;
                                          nodeName_local = psVar2;
                                          std::__cxx11::string::~string((string *)&local_340);
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"read");
                                          if (bVar1) {
                                            psVar2 = (string *)operator_new(200);
                                            local_369 = 1;
                                            std::__cxx11::string::string
                                                      ((string *)&local_368,(string *)token_local);
                                            Read::Read((Read *)psVar2,&local_368,local_20);
                                            local_369 = 0;
                                            nodeName_local = psVar2;
                                            std::__cxx11::string::~string((string *)&local_368);
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"return");
                                            if (bVar1) {
                                              psVar2 = (string *)operator_new(200);
                                              local_391 = 1;
                                              std::__cxx11::string::string
                                                        ((string *)&local_390,(string *)token_local)
                                              ;
                                              Return::Return((Return *)psVar2,&local_390,local_20);
                                              local_391 = 0;
                                              nodeName_local = psVar2;
                                              std::__cxx11::string::~string((string *)&local_390);
                                            }
                                            else {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"sign");
                                              if (bVar1) {
                                                psVar2 = (string *)operator_new(200);
                                                local_3b9 = 1;
                                                std::__cxx11::string::string
                                                          ((string *)&local_3b8,
                                                           (string *)token_local);
                                                Sign::Sign((Sign *)psVar2,&local_3b8,local_20);
                                                local_3b9 = 0;
                                                nodeName_local = psVar2;
                                                std::__cxx11::string::~string((string *)&local_3b8);
                                              }
                                              else {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"STATEMENTS");
                                                if ((!bVar1) &&
                                                   (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"STATEMENTBLOCK"), !bVar1)) {
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"variable");
                                                  if (bVar1) {
                                                    psVar2 = (string *)operator_new(200);
                                                    local_409 = 1;
                                                    std::__cxx11::string::string
                                                              ((string *)&local_408,
                                                               (string *)token_local);
                                                    VarDecl::VarDecl((VarDecl *)psVar2,&local_408,
                                                                     local_20);
                                                    local_409 = 0;
                                                    nodeName_local = psVar2;
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_408);
                                                    return (ASTNode *)nodeName_local;
                                                  }
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"while");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)token_local,"write");
                                                  if (!bVar1) {
                                                    this = (ASTNode *)operator_new(200);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_480,
                                                               (string *)token_local);
                                                    ASTNode::ASTNode(this,&local_480,local_20);
                                                    nodeName_local = (string *)this;
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_480);
                                                    return (ASTNode *)nodeName_local;
                                                  }
                                                  psVar2 = (string *)operator_new(200);
                                                  local_459 = 1;
                                                  std::__cxx11::string::string
                                                            ((string *)&local_458,
                                                             (string *)token_local);
                                                  Write::Write((Write *)psVar2,&local_458,local_20);
                                                  local_459 = 0;
                                                  nodeName_local = psVar2;
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_458);
                                                  return (ASTNode *)nodeName_local;
                                                  }
                                                  psVar2 = (string *)operator_new(200);
                                                  local_431 = 1;
                                                  std::__cxx11::string::string
                                                            ((string *)&local_430,
                                                             (string *)token_local);
                                                  While::While((While *)psVar2,&local_430,local_20);
                                                  local_431 = 0;
                                                  nodeName_local = psVar2;
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_430);
                                                  return (ASTNode *)nodeName_local;
                                                }
                                                psVar2 = (string *)operator_new(200);
                                                local_3e1 = 1;
                                                std::__cxx11::string::string
                                                          ((string *)&local_3e0,
                                                           (string *)token_local);
                                                Statements::Statements
                                                          ((Statements *)psVar2,&local_3e0,local_20)
                                                ;
                                                local_3e1 = 0;
                                                nodeName_local = psVar2;
                                                std::__cxx11::string::~string((string *)&local_3e0);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (ASTNode *)nodeName_local;
}

Assistant:

AST::ASTNode *AST::ASTBuilder::createCustomNode(std::string &nodeName, Token *token) {
    if (nodeName == "add") return new AddOp(nodeName, token);
    else if (nodeName == "ARRAYDIMENSIONS") return new ArrayDim(nodeName, token);
    else if (nodeName == "=") return new AssignOp(nodeName, token);
    else if (nodeName == "calls") return new Calls(nodeName, token);
    else if (nodeName == "call") return new Call(nodeName, token);
    else if (nodeName == "classes") return new ClassDecls(nodeName, token);
    else if (nodeName == "class") return new ClassDecl(nodeName, token);
    else if (nodeName == "cmp") return new CompareOp(nodeName, token);
    else if (nodeName == "func_body") return new FuncBody(nodeName, token);
    else if (nodeName == "func_call") return new FuncCall(nodeName, token);
    else if (nodeName == "func_def") return new FuncDef(nodeName, token);
    else if (nodeName == "func_decl") return new FuncDecl(nodeName, token);
    else if (nodeName == "params") return new FuncParams(nodeName, token);
    else if (nodeName == "params_call") return new FuncCallParams(nodeName, token);
    else if (nodeName == "if") return new If(nodeName, token);
    else if (nodeName == "LOCALSCOPE") return new Local(nodeName, token);
    else if (nodeName == "main") return new MainFunc(nodeName, token);
    else if (nodeName == "mult") return new MultOp(nodeName, token);
    else if (nodeName == "number") return new Number(nodeName, token);
    else if (nodeName == "PROGRAM") return new Program(nodeName, token);
    else if (nodeName == "read") return new Read(nodeName, token);
    else if (nodeName == "return") return new Return(nodeName, token);
    else if (nodeName == "sign") return new Sign(nodeName, token);
    else if (nodeName == "STATEMENTS" || nodeName == "STATEMENTBLOCK") return new Statements(nodeName, token);
    else if (nodeName == "variable") return new VarDecl(nodeName, token);
    else if (nodeName == "while") return new While(nodeName, token);
    else if (nodeName == "write") return new Write(nodeName, token);
    else return new ASTNode(nodeName, token);
}